

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CollapseButton(ImGuiID id,ImVec2 *pos)

{
  bool bVar1;
  ImRect *in_RSI;
  ImVec2 IVar2;
  ImVec2 bb_00;
  ImVec2 center;
  ImU32 text_col;
  ImU32 bg_col;
  bool pressed;
  bool held;
  bool hovered;
  ImRect bb;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  ImGuiMouseButton button;
  int num_segments;
  ImGuiWindow *window_00;
  undefined4 in_stack_ffffffffffffff90;
  ImGuiID in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  byte bVar4;
  uint in_stack_ffffffffffffffac;
  uint uVar3;
  bool *in_stack_ffffffffffffffb8;
  float id_00;
  ImVec2 local_20;
  ImVec2 local_18;
  
  local_18 = (ImVec2)GImGui;
  local_20 = (ImVec2)GImGui->CurrentWindow;
  window_00 = (ImGuiWindow *)&stack0xffffffffffffffb8;
  ImVec2::ImVec2((ImVec2 *)window_00,GImGui->FontSize,GImGui->FontSize);
  IVar2 = ::operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (ImVec2 *)0x2ae42a);
  id_00 = IVar2.y;
  IVar2 = ::operator*((ImVec2 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0.0);
  bb_00 = ::operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      (ImVec2 *)0x2ae461);
  ImRect::ImRect((ImRect *)&stack0xffffffffffffffd0,&in_RSI->Min,(ImVec2 *)&stack0xffffffffffffffc8)
  ;
  ItemAdd((ImRect *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
          in_stack_ffffffffffffff94,in_RSI);
  bVar1 = ButtonBehavior((ImRect *)bb_00,(ImGuiID)id_00,in_stack_ffffffffffffffb8,(bool *)IVar2,
                         in_stack_ffffffffffffffac);
  uVar3 = (uint)CONCAT21((short)(in_stack_ffffffffffffffac >> 0x10),bVar1) << 8;
  if (((in_stack_ffffffffffffffac & 0x10000) == 0) || ((in_stack_ffffffffffffffac & 0x1000000) == 0)
     ) {
    num_segments = 0x15;
    if ((in_stack_ffffffffffffffac & 0x1000000) != 0) {
      num_segments = 0x16;
    }
  }
  else {
    num_segments = 0x17;
  }
  GetColorU32((ImGuiCol)((ulong)window_00 >> 0x20),SUB84(window_00,0));
  GetColorU32((ImGuiCol)((ulong)window_00 >> 0x20),SUB84(window_00,0));
  ImRect::GetCenter((ImRect *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (((uVar3 & 0x1000000) != 0) || ((uVar3 & 0x10000) != 0)) {
    ImDrawList::AddCircleFilled
              ((ImDrawList *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               &in_RSI->Min,(float)((ulong)window_00 >> 0x20),(ImU32)window_00,num_segments);
  }
  bVar4 = (byte)(uVar3 >> 8);
  button = (ImGuiMouseButton)*(ImDrawList **)((long)local_20 + 0x2b8);
  ::operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
              (ImVec2 *)0x2ae5a0);
  RenderArrow((ImDrawList *)window,(ImVec2)g,(ImU32)bb.Max.y,(ImGuiDir)bb.Max.x,bb.Min.y);
  bVar1 = IsItemActive();
  if ((bVar1) && (bVar1 = IsMouseDragging(button,in_stack_ffffffffffffff6c), bVar1)) {
    StartMouseMovingWindow(window_00);
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool ImGui::CollapseButton(ImGuiID id, const ImVec2& pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    ItemAdd(bb, id);
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_None);

    // Render
    ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    ImU32 text_col = GetColorU32(ImGuiCol_Text);
    ImVec2 center = bb.GetCenter();
    if (hovered || held)
        window->DrawList->AddCircleFilled(center/*+ ImVec2(0.0f, -0.5f)*/, g.FontSize * 0.5f + 1.0f, bg_col, 12);
    RenderArrow(window->DrawList, bb.Min + g.Style.FramePadding, text_col, window->Collapsed ? ImGuiDir_Right : ImGuiDir_Down, 1.0f);

    // Switch to moving the window after mouse is moved beyond the initial drag threshold
    if (IsItemActive() && IsMouseDragging(0))
        StartMouseMovingWindow(window);

    return pressed;
}